

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O1

int main(int argc,char **argv)

{
  ACUTEST_CMDLINE_OPTION_ *pAVar1;
  acutest_test_ *test;
  bool bVar2;
  acutest_test_data_ *paVar3;
  byte bVar4;
  FILE *__s;
  int n_7;
  int iVar5;
  int iVar6;
  int iVar7;
  acutest_state_ aVar8;
  __pid_t __pid;
  char *pcVar9;
  ACUTEST_CMDLINE_OPTION_ *pAVar10;
  long lVar11;
  ssize_t sVar12;
  char *pcVar13;
  uint *puVar14;
  char *pcVar15;
  char cVar16;
  int n;
  uint uVar17;
  size_t sVar18;
  timespec *ptVar19;
  int n_6;
  int n_8;
  int n_4;
  ulong uVar20;
  ACUTEST_CMDLINE_OPTION_ *pAVar21;
  int n_5;
  int iVar22;
  uint uVar23;
  bool bVar24;
  undefined1 auStack_278 [8];
  acutest_timer_type_ end;
  undefined8 local_99;
  __time_t _Stack_91;
  char *local_78;
  undefined1 local_70 [8];
  acutest_timer_type_ start;
  int exit_code;
  int local_34;
  
  acutest_argv0_ = *argv;
  acutest_colorize_ = isatty(1);
  acutest_list_size_ = 1;
  acutest_test_data_ = (acutest_test_data_ *)calloc(0x15,0x10);
  if (acutest_test_data_ == (acutest_test_data_ *)0x0) {
    main_cold_1();
  }
  if (1 < argc) {
    iVar22 = 1;
    bVar2 = false;
LAB_0010aab3:
    if (!bVar2) {
      pcVar13 = argv[iVar22];
      iVar7 = strcmp(pcVar13,"-");
      if (iVar7 == 0) goto LAB_0010aabb;
      iVar7 = strcmp(pcVar13,"--");
      if (iVar7 == 0) {
        bVar2 = true;
        local_34 = 0;
        goto LAB_0010aaca;
      }
      if (*pcVar13 != '-') {
        bVar2 = false;
        goto LAB_0010aac5;
      }
      bVar24 = false;
      iVar7 = 0x58;
      pAVar21 = acutest_cmdline_options_;
      local_34 = 0;
      do {
        pcVar13 = pAVar21->longname;
        if (pcVar13 == (char *)0x0) {
LAB_0010ab69:
          if (((pAVar21->shortname != '\0') && (pcVar13 = argv[iVar22], *pcVar13 == '-')) &&
             (pcVar13[1] == pAVar21->shortname)) {
            if ((pAVar21->flags & 2) == 0) {
              iVar6 = acutest_cmdline_callback_(iVar7,(char *)0x0);
              if (iVar6 == 0) {
                pcVar13 = argv[iVar22];
                cVar16 = pcVar13[2];
                local_34 = 0;
                iVar6 = local_34;
                if (cVar16 != '\0') {
                  lVar11 = 0;
                  goto LAB_0010ad75;
                }
              }
            }
            else if (pcVar13[2] == '\0') {
              iVar5 = iVar22 + 1;
              if (iVar5 < argc) {
                iVar6 = acutest_cmdline_callback_(iVar7,argv[iVar5]);
                iVar22 = iVar5;
              }
              else {
                iVar6 = acutest_cmdline_callback_(-0x7ffffffe,pcVar13);
              }
            }
            else {
              iVar6 = acutest_cmdline_callback_(iVar7,pcVar13 + 2);
            }
            break;
          }
        }
        else {
          pcVar9 = argv[iVar22];
          iVar5 = strncmp(pcVar9,"--",2);
          if (iVar5 != 0) goto LAB_0010ab69;
          sVar18 = strlen(pcVar13);
          local_78 = pcVar9 + 2;
          iVar5 = strncmp(local_78,pcVar13,sVar18);
          if (iVar5 == 0) {
            if (pcVar9[sVar18 + 2] == '=') {
              if ((pAVar21->flags & 3) == 0) {
                pcVar9 = auStack_278;
                snprintf(pcVar9,0x21,"--%s",pcVar13);
                iVar7 = -0x7ffffffd;
              }
              else {
                pcVar9 = local_78 + sVar18 + 1;
              }
              local_34 = acutest_cmdline_callback_(iVar7,pcVar9);
              bVar2 = true;
            }
            else {
              if (pcVar9[sVar18 + 2] != '\0') goto LAB_0010abad;
              if ((pAVar21->flags & 2) == 0) {
                pcVar9 = (char *)0x0;
              }
              else {
                iVar7 = -0x7ffffffe;
              }
              local_34 = acutest_cmdline_callback_(iVar7,pcVar9);
              bVar2 = true;
            }
          }
          else {
LAB_0010abad:
            bVar2 = false;
          }
          iVar6 = local_34;
          if (bVar2) break;
        }
        iVar7 = pAVar21[1].id;
        pAVar21 = pAVar21 + 1;
        bVar24 = iVar7 == 0;
        iVar6 = local_34;
      } while (!bVar24);
      goto LAB_0010ac82;
    }
LAB_0010aabb:
    pcVar13 = argv[iVar22];
LAB_0010aac5:
    local_34 = acutest_cmdline_callback_(0,pcVar13);
    goto LAB_0010aaca;
  }
LAB_0010ae53:
  bVar4 = acutest_exclude_mode_;
  paVar3 = acutest_test_data_;
  if (acutest_timer_ - 1U < 2) {
    acutest_timer_id_ = acutest_timer_;
  }
  lVar11 = 0;
  iVar22 = 0;
  do {
    iVar22 = iVar22 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar11) == -3);
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x150);
  if (iVar22 == 0) {
    lVar11 = 0;
    do {
      *(undefined4 *)((long)&paVar3->state + lVar11) = 0xfffffffe;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x150);
  }
  else {
    lVar11 = 0;
    do {
      *(uint *)((long)&paVar3->state + lVar11) =
           ~(uint)(*(int *)((long)&paVar3->state + lVar11) == -3 ^ bVar4) | 0xfffffffe;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x150);
  }
  iVar22 = acutest_no_exec_;
  if (acutest_no_exec_ < 0) {
    lVar11 = 0;
    uVar17 = 0;
    do {
      uVar17 = uVar17 + (*(int *)((long)&acutest_test_data_->state + lVar11) == -2);
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x150);
    iVar22 = 1;
    if (1 < uVar17) {
      auStack_278[0] = 10;
      iVar7 = 0;
      iVar22 = open("/proc/self/status",0);
      if (iVar22 != -1) {
        uVar20 = 1;
LAB_0010af58:
        do {
          if (uVar20 < 0x1ff) {
            sVar12 = read(iVar22,auStack_278 + uVar20,0x1ff - uVar20);
            lVar11 = 0;
            if (0 < sVar12) {
              lVar11 = sVar12;
            }
            uVar20 = uVar20 + lVar11;
            if (0 < sVar12) goto LAB_0010af58;
          }
          auStack_278[uVar20] = 0;
          pcVar13 = strstr(auStack_278,"\nTracerPid:");
          if (pcVar13 < (char *)((long)&local_99 + 1U) && pcVar13 != (char *)0x0) {
            iVar7 = atoi(pcVar13 + 0xb);
LAB_0010afd5:
            bVar2 = false;
          }
          else {
            if (uVar20 != 0x1ff) goto LAB_0010afd5;
            auStack_278 = (undefined1  [8])local_99;
            end.tv_sec = _Stack_91;
            bVar2 = true;
            uVar20 = 0x20;
          }
        } while (bVar2);
        close(iVar22);
        iVar22 = 1;
        if (iVar7 != 0) goto LAB_0010b01f;
      }
      iVar22 = 0;
    }
  }
LAB_0010b01f:
  acutest_no_exec_ = iVar22;
  if (acutest_tap_ == '\x01') {
    if (2 < acutest_verbose_level_) {
      acutest_verbose_level_ = 2;
    }
    acutest_no_summary_ = 1;
    if (acutest_worker_ == '\0') {
      lVar11 = 0;
      uVar20 = 0;
      do {
        uVar20 = (ulong)((int)uVar20 +
                        (uint)(*(int *)((long)&acutest_test_data_->state + lVar11) == -2));
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x150);
      printf("1..%d\n",uVar20);
    }
  }
  lVar11 = 0;
  iVar22 = acutest_worker_index_;
  do {
    if (*(int *)((long)&acutest_test_data_->state + lVar11) == -2) {
      test = (acutest_test_ *)((long)&acutest_list_[0].name + lVar11);
      acutest_test_already_logged_ = 0;
      acutest_current_test_ = test;
      clock_gettime(acutest_timer_id_,(timespec *)local_70);
      if (acutest_no_exec_ == 0) {
        fflush(_stdout);
        fflush(_stderr);
        __pid = fork();
        if (__pid == -1) {
          puVar14 = (uint *)__errno_location();
          pcVar13 = strerror(*puVar14);
          acutest_error_("Cannot fork. %s [%d]",pcVar13,(ulong)*puVar14);
        }
        else {
          if (__pid == 0) {
            acutest_worker_ = 1;
            aVar8 = acutest_do_run_(test,iVar22);
            acutest_exit_(aVar8);
          }
          waitpid(__pid,(int *)((long)&start.tv_nsec + 4),0);
          uVar17 = start.tv_nsec._4_4_ & 0x7f;
          if (uVar17 == 0) {
            aVar8 = start.tv_nsec._4_4_ >> 8 & 0xff;
            goto LAB_0010b1ca;
          }
          if ((int)(uVar17 * 0x1000000 + 0x1000000) < 0x2000000) {
            acutest_error_("Test ended in an unexpected way [%d].",(ulong)start.tv_nsec._4_4_);
          }
          else {
            if ((uVar17 < 0x10) && ((0x452fU >> ((uint)((ulong)uVar17 - 1) & 0x1f) & 1) != 0)) {
              ptVar19 = (timespec *)
                        (&DAT_001410cc + *(int *)(&DAT_001410cc + ((ulong)uVar17 - 1) * 4));
            }
            else {
              snprintf((char *)auStack_278,0x20,"signal %d");
              ptVar19 = (timespec *)auStack_278;
            }
            acutest_error_("Test interrupted by %s.",ptVar19);
          }
        }
        aVar8 = ACUTEST_STATE_FAILED;
      }
      else {
        aVar8 = acutest_do_run_(test,iVar22);
      }
LAB_0010b1ca:
      iVar22 = iVar22 + 1;
      clock_gettime(acutest_timer_id_,(timespec *)auStack_278);
      paVar3 = acutest_test_data_;
      acutest_current_test_ = (acutest_test_ *)0x0;
      *(acutest_state_ *)((long)&acutest_test_data_->state + lVar11) = aVar8;
      *(double *)((long)&paVar3->duration + lVar11) =
           (double)(end.tv_sec - start.tv_sec) / 1000000000.0 +
           (double)((long)auStack_278 -
                   CONCAT53(local_70._3_5_,CONCAT12(local_70[2],CONCAT11(local_70[1],local_70[0]))))
      ;
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x150);
  if (0 < acutest_verbose_level_ && (acutest_no_summary_ & 1) == 0) {
    lVar11 = 0;
    iVar22 = 0;
    do {
      iVar22 = iVar22 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar11) == -1);
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x150);
    lVar11 = 0;
    uVar17 = 0;
    do {
      uVar17 = uVar17 + (*(int *)((long)&acutest_test_data_->state + lVar11) == 0);
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x150);
    lVar11 = 0;
    uVar23 = 0;
    do {
      uVar23 = uVar23 + (*(int *)((long)&acutest_test_data_->state + lVar11) == 1);
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x150);
    if (2 < acutest_verbose_level_) {
      acutest_colored_printf_(10,"Summary:\n");
      printf("  Count of run unit tests:        %4d\n",(ulong)(0x15U - iVar22));
      printf("  Count of successful unit tests: %4d\n",(ulong)uVar17);
      printf("  Count of failed unit tests:     %4d\n",(ulong)uVar23);
    }
    if (uVar23 == 0) {
      acutest_colored_printf_(0xc,"SUCCESS:");
      puts(" No unit tests have failed.");
    }
    else {
      acutest_colored_printf_(0xb,"FAILED:");
      pcVar13 = "have";
      if (uVar23 == 1) {
        pcVar13 = "has";
      }
      printf(" %d of %d unit tests %s failed.\n",(ulong)uVar23,(ulong)(0x15U - iVar22),pcVar13);
    }
    if (2 < acutest_verbose_level_) {
      putchar(10);
    }
  }
  __s = acutest_xml_output_;
  if (acutest_xml_output_ != (FILE *)0x0) {
    pcVar13 = *argv;
    pcVar15 = strrchr(pcVar13,0x2f);
    pcVar9 = pcVar15 + 1;
    if (pcVar15 == (char *)0x0) {
      pcVar9 = pcVar13;
    }
    fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)__s);
    lVar11 = 0;
    uVar20 = 0;
    do {
      uVar20 = (ulong)((int)uVar20 +
                      (uint)(*(int *)((long)&acutest_test_data_->state + lVar11) == 1));
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x150);
    lVar11 = 0;
    iVar22 = 0;
    do {
      iVar22 = iVar22 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar11) == 2);
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x150);
    lVar11 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar11) == -1);
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x150);
    fprintf((FILE *)acutest_xml_output_,
            "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",pcVar9
            ,0x15,uVar20,(ulong)(uint)(iVar7 + iVar22));
    lVar11 = 0;
    do {
      paVar3 = acutest_test_data_;
      bVar2 = true;
      fprintf((FILE *)acutest_xml_output_,"  <testcase name=\"%s\" time=\"%.2f\">\n",
              (int)*(undefined8 *)((long)&acutest_test_data_->duration + lVar11),
              *(undefined8 *)((long)&acutest_list_[0].name + lVar11));
      iVar22 = *(int *)((long)&paVar3->state + lVar11);
      if (iVar22 == 2) {
LAB_0010b4b1:
        bVar2 = false;
        pcVar13 = "<skipped />";
      }
      else if (iVar22 == 0) {
        pcVar13 = (char *)0x0;
      }
      else {
        if (iVar22 == -1) goto LAB_0010b4b1;
        bVar2 = false;
        pcVar13 = "<failure />";
      }
      if (!bVar2) {
        fprintf((FILE *)acutest_xml_output_,"    %s\n",pcVar13);
      }
      fwrite("  </testcase>\n",0xe,1,(FILE *)acutest_xml_output_);
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x150);
    fwrite("</testsuite>\n",0xd,1,(FILE *)acutest_xml_output_);
    fclose((FILE *)acutest_xml_output_);
  }
  if (acutest_worker_ == '\x01') {
    lVar11 = 0;
    iVar22 = 0;
    do {
      iVar22 = iVar22 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar11) == -1);
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x150);
    if (iVar22 == 0x14) {
      lVar11 = 0;
      do {
        uVar17 = *(uint *)((long)&acutest_test_data_->state + lVar11);
        if (uVar17 != 0xffffffff) goto LAB_0010b5b8;
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x150);
      uVar17 = 1;
      goto LAB_0010b5b8;
    }
  }
  lVar11 = 0;
  iVar22 = 0;
  do {
    iVar22 = iVar22 + (uint)(*(int *)((long)&acutest_test_data_->state + lVar11) == 1);
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x150);
  uVar17 = (uint)(iVar22 != 0);
LAB_0010b5b8:
  free(acutest_test_data_);
  return uVar17;
  while( true ) {
    cVar16 = pcVar13[lVar11 + 3];
    lVar11 = lVar11 + 1;
    iVar6 = local_34;
    if (cVar16 == '\0') break;
LAB_0010ad75:
    iVar7 = 0x58;
    pAVar21 = acutest_cmdline_options_;
    if (cVar16 != 'X') {
      pAVar10 = acutest_cmdline_options_;
      do {
        iVar7 = pAVar10[1].id;
        if (iVar7 == 0) {
          iVar5 = -0x7fffffff;
          goto LAB_0010adb4;
        }
        pAVar21 = pAVar10 + 1;
        pAVar1 = pAVar10 + 1;
        pAVar10 = pAVar21;
      } while (cVar16 != pAVar1->shortname);
    }
    iVar5 = -0x7ffffffe;
    if ((pAVar21->flags & 2) == 0) {
      pcVar9 = (char *)0x0;
      iVar5 = iVar7;
    }
    else {
LAB_0010adb4:
      local_70[0] = '-';
      local_70[2] = 0;
      pcVar9 = local_70;
      local_70[1] = cVar16;
    }
    iVar6 = acutest_cmdline_callback_(iVar5,pcVar9);
    if (iVar6 != 0) break;
  }
LAB_0010ac82:
  local_34 = iVar6;
  bVar2 = false;
  if (bVar24) {
    pcVar13 = argv[iVar22];
    if (*pcVar13 == '-') {
      iVar7 = strncmp(pcVar13,"--",2);
      if ((iVar7 == 0) && (pcVar9 = strchr(pcVar13,0x3d), pcVar9 != (char *)0x0)) {
        sVar18 = (long)pcVar9 - (long)pcVar13;
        if (0x1f < sVar18) {
          sVar18 = 0x20;
        }
        strncpy(auStack_278,pcVar13,sVar18);
        auStack_278[sVar18] = 0;
        pcVar13 = auStack_278;
      }
      iVar7 = -0x7fffffff;
    }
    else {
      iVar7 = 0;
    }
    bVar2 = false;
    local_34 = acutest_cmdline_callback_(iVar7,pcVar13);
  }
LAB_0010aaca:
  if ((local_34 != 0) || (iVar22 = iVar22 + 1, argc <= iVar22)) goto LAB_0010ae53;
  goto LAB_0010aab3;
}

Assistant:

int
main(int argc, char** argv)
{
    int i, index;
    int exit_code = 1;

    acutest_argv0_ = argv[0];

#if defined ACUTEST_UNIX_
    acutest_colorize_ = isatty(STDOUT_FILENO);
#elif defined ACUTEST_WIN_
 #if defined _BORLANDC_
    acutest_colorize_ = isatty(_fileno(stdout));
 #else
    acutest_colorize_ = _isatty(_fileno(stdout));
 #endif
#else
    acutest_colorize_ = 0;
#endif

    /* Count all test units */
    acutest_list_size_ = 0;
    for(i = 0; acutest_list_[i].func != NULL; i++)
        acutest_list_size_++;

    acutest_test_data_ = (struct acutest_test_data_*)calloc(acutest_list_size_, sizeof(struct acutest_test_data_));
    if(acutest_test_data_ == NULL) {
        fprintf(stderr, "Out of memory.\n");
        acutest_exit_(2);
    }

    /* Parse options */
    acutest_cmdline_read_(acutest_cmdline_options_, argc, argv, acutest_cmdline_callback_);

    /* Initialize the proper timer. */
    acutest_timer_init_();

#if defined(ACUTEST_WIN_)
    SetUnhandledExceptionFilter(acutest_seh_exception_filter_);
#ifdef _MSC_VER
    _set_abort_behavior(0, _WRITE_ABORT_MSG);
#endif
#endif

    /* Determine what to run. */
    if(acutest_count_(ACUTEST_STATE_SELECTED) > 0) {
        enum acutest_state_ if_selected;
        enum acutest_state_ if_unselected;

        if(!acutest_exclude_mode_) {
            if_selected = ACUTEST_STATE_NEEDTORUN;
            if_unselected = ACUTEST_STATE_EXCLUDED;
        } else {
            if_selected = ACUTEST_STATE_EXCLUDED;
            if_unselected = ACUTEST_STATE_NEEDTORUN;
        }

        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state == ACUTEST_STATE_SELECTED)
                acutest_test_data_[i].state = if_selected;
            else
                acutest_test_data_[i].state = if_unselected;
        }
    } else {
        /* By default, we want to run all tests. */
        for(i = 0; acutest_list_[i].func != NULL; i++)
            acutest_test_data_[i].state = ACUTEST_STATE_NEEDTORUN;
    }

    /* By default, we want to suppress running tests as child processes if we
     * run just one test, or if we're under debugger: Debugging tests is then
     * so much easier. */
    if(acutest_no_exec_ < 0) {
        if(acutest_count_(ACUTEST_STATE_NEEDTORUN) <= 1  ||  acutest_under_debugger_())
            acutest_no_exec_ = 1;
        else
            acutest_no_exec_ = 0;
    }

    if(acutest_tap_) {
        /* TAP requires we know test result ("ok", "not ok") before we output
         * anything about the test, and this gets problematic for larger verbose
         * levels. */
        if(acutest_verbose_level_ > 2)
            acutest_verbose_level_ = 2;

        /* TAP harness should provide some summary. */
        acutest_no_summary_ = 1;

        if(!acutest_worker_)
            printf("1..%d\n", acutest_count_(ACUTEST_STATE_NEEDTORUN));
    }

    index = acutest_worker_index_;
    for(i = 0; acutest_list_[i].func != NULL; i++) {
        if(acutest_test_data_[i].state == ACUTEST_STATE_NEEDTORUN)
            acutest_run_(&acutest_list_[i], index++, i);
    }

    /* Write a summary */
    if(!acutest_no_summary_ && acutest_verbose_level_ >= 1) {
        int n_run, n_success, n_failed ;

        n_run = acutest_list_size_ - acutest_count_(ACUTEST_STATE_EXCLUDED);
        n_success = acutest_count_(ACUTEST_STATE_SUCCESS);
        n_failed = acutest_count_(ACUTEST_STATE_FAILED);

        if(acutest_verbose_level_ >= 3) {
            acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Summary:\n");

            printf("  Count of run unit tests:        %4d\n", n_run);
            printf("  Count of successful unit tests: %4d\n", n_success);
            printf("  Count of failed unit tests:     %4d\n", n_failed);
        }

        if(n_failed == 0) {
            acutest_colored_printf_(ACUTEST_COLOR_GREEN_INTENSIVE_, "SUCCESS:");
            printf(" No unit tests have failed.\n");
        } else {
            acutest_colored_printf_(ACUTEST_COLOR_RED_INTENSIVE_, "FAILED:");
            printf(" %d of %d unit tests %s failed.\n",
                    n_failed, n_run, (n_failed == 1) ? "has" : "have");
        }

        if(acutest_verbose_level_ >= 3)
            printf("\n");
    }

    if (acutest_xml_output_) {
        const char* suite_name = acutest_basename_(argv[0]);
        fprintf(acutest_xml_output_, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
        fprintf(acutest_xml_output_, "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",
            suite_name,
            (int)acutest_list_size_,
            acutest_count_(ACUTEST_STATE_FAILED),
            acutest_count_(ACUTEST_STATE_SKIPPED) + acutest_count_(ACUTEST_STATE_EXCLUDED));
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            struct acutest_test_data_ *details = &acutest_test_data_[i];
            const char* str_state;
            fprintf(acutest_xml_output_, "  <testcase name=\"%s\" time=\"%.2f\">\n", acutest_list_[i].name, details->duration);

            switch(details->state) {
                case ACUTEST_STATE_SUCCESS:     str_state = NULL; break;
                case ACUTEST_STATE_EXCLUDED:    /* Fall through. */
                case ACUTEST_STATE_SKIPPED:     str_state = "<skipped />"; break;
                case ACUTEST_STATE_FAILED:      /* Fall through. */
                default:                        str_state = "<failure />"; break;
            }

            if(str_state != NULL)
                fprintf(acutest_xml_output_, "    %s\n", str_state);
            fprintf(acutest_xml_output_, "  </testcase>\n");
        }
        fprintf(acutest_xml_output_, "</testsuite>\n");
        fclose(acutest_xml_output_);
    }

    if(acutest_worker_  &&  acutest_count_(ACUTEST_STATE_EXCLUDED)+1 == acutest_list_size_) {
        /* If we are the child process, we need to propagate the test state
         * without any moderation. */
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state != ACUTEST_STATE_EXCLUDED) {
                exit_code = (int) acutest_test_data_[i].state;
                break;
            }
        }
    } else {
        if(acutest_count_(ACUTEST_STATE_FAILED) > 0)
            exit_code = 1;
        else
            exit_code = 0;
    }

    acutest_cleanup_();
    return exit_code;
}